

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::updateAtomVel(RigidBody *this)

{
  undefined4 *puVar1;
  pointer pVVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  uint j;
  long lVar11;
  uint j_2;
  double *pdVar12;
  ulong uVar13;
  uint k;
  long lVar14;
  uint i_3;
  uint i_2;
  double (*__return_storage_ptr__) [3];
  uint i;
  long lVar15;
  undefined4 uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  Vector<double,_3U> result_3;
  SquareMatrix3<double> result;
  Vector<double,_3U> result_2;
  Mat3x3d mat;
  Mat3x3d I;
  double local_1e8 [4];
  double local_1c8 [10];
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  uint uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  double local_148 [10];
  double local_f8 [17];
  double local_70;
  double local_68;
  undefined1 local_60 [16];
  double local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  double local_30;
  undefined8 local_28;
  
  lVar11 = (long)(this->super_StuntDouble).localIndex_;
  lVar15 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                            angularMomentum.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (this->super_StuntDouble).storage_);
  local_168 = *(undefined8 *)(lVar15 + 0x10 + lVar11 * 0x18);
  local_158 = (undefined4)local_168;
  uStack_160 = 0;
  uStack_154 = (uint)((ulong)local_168 >> 0x20) ^ 0x80000000;
  uStack_150 = 0;
  uStack_14c = 0x80000000;
  puVar1 = (undefined4 *)(lVar15 + lVar11 * 0x18);
  local_178 = *puVar1;
  uStack_174 = puVar1[1];
  uStack_170 = puVar1[2];
  uStack_16c = puVar1[3];
  (*(this->super_StuntDouble)._vptr_StuntDouble[5])(local_f8 + 9,this);
  lVar15 = 0;
  local_68 = 0.0;
  auVar7._8_4_ = uStack_170;
  auVar7._0_8_ = CONCAT44(uStack_174,local_178);
  auVar7._12_4_ = uStack_16c;
  auVar18._8_8_ = auVar7._8_8_ ^ 0x8000000000000000;
  auVar18._0_8_ = local_168;
  local_50 = (double)CONCAT44(uStack_154,local_158) / local_70;
  uVar16 = (undefined4)((ulong)local_f8[0xd] >> 0x20);
  auVar5._8_4_ = SUB84(local_f8[0xd],0);
  auVar5._0_8_ = local_70;
  auVar5._12_4_ = uVar16;
  local_60 = divpd(auVar18,auVar5);
  local_48 = 0;
  local_30 = -(double)CONCAT44(uStack_174,local_178) / local_f8[9];
  auVar6._8_4_ = SUB84(local_f8[0xd],0);
  auVar6._0_8_ = local_f8[9];
  auVar6._12_4_ = uVar16;
  local_40 = divpd(auVar7,auVar6);
  local_28 = 0;
  __return_storage_ptr__ = (double (*) [3])local_148;
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this->super_StuntDouble);
  local_1c8[8] = 0.0;
  local_1c8[6] = 0.0;
  local_1c8[7] = 0.0;
  local_1c8[4] = 0.0;
  local_1c8[5] = 0.0;
  local_1c8[2] = 0.0;
  local_1c8[3] = 0.0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  do {
    lVar11 = 0;
    pdVar9 = &local_68;
    do {
      dVar17 = local_1c8[lVar15 * 3 + lVar11];
      lVar14 = 0;
      pdVar8 = pdVar9;
      do {
        dVar17 = dVar17 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                          super_RectMatrix<double,_3U,_3U>).data_[0][lVar14] * *pdVar8;
        lVar14 = lVar14 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar14 != 3);
      local_1c8[lVar15 * 3 + lVar11] = dVar17;
      lVar11 = lVar11 + 1;
      pdVar9 = pdVar9 + 1;
    } while (lVar11 != 3);
    lVar15 = lVar15 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar15 != 3);
  pdVar8 = local_f8;
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[8] = 0.0;
  pdVar9 = local_1c8;
  lVar15 = 0;
  do {
    lVar11 = 0;
    pdVar12 = pdVar8;
    do {
      *pdVar12 = pdVar9[lVar11];
      lVar11 = lVar11 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar11 != 3);
    lVar15 = lVar15 + 1;
    pdVar8 = pdVar8 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar15 != 3);
  lVar11 = (long)(this->super_StuntDouble).localIndex_;
  lVar15 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                            velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (this->super_StuntDouble).storage_);
  local_1c8[2] = (double)*(undefined8 *)(lVar15 + 0x10 + lVar11 * 0x18);
  pdVar9 = (double *)(lVar15 + lVar11 * 0x18);
  local_1c8[0] = *pdVar9;
  local_1c8[1] = pdVar9[1];
  pVVar2 = (this->refCoords_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(this->refCoords_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
  if (lVar15 != 0) {
    uVar10 = (lVar15 >> 3) * -0x5555555555555555;
    ppAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      pAVar4 = ppAVar3[uVar13];
      local_148[0] = 0.0;
      local_148[1] = 0.0;
      local_148[2] = 0.0;
      lVar15 = 0;
      pdVar9 = local_f8;
      do {
        dVar17 = local_148[lVar15];
        lVar11 = 0;
        do {
          dVar17 = dVar17 + pdVar9[lVar11] * pVVar2[uVar13].super_Vector<double,_3U>.data_[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        local_148[lVar15] = dVar17;
        lVar15 = lVar15 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar15 != 3);
      local_1e8[0] = 0.0;
      local_1e8[1] = 0.0;
      local_1e8[2] = 0.0;
      lVar15 = 0;
      do {
        local_1e8[lVar15] = local_1c8[lVar15] + local_148[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      lVar11 = (long)(pAVar4->super_StuntDouble).localIndex_;
      lVar15 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (pAVar4->super_StuntDouble).storage_);
      *(double *)(lVar15 + 0x10 + lVar11 * 0x18) = local_1e8[2];
      pdVar9 = (double *)(lVar15 + lVar11 * 0x18);
      *pdVar9 = local_1e8[0];
      pdVar9[1] = local_1e8[1];
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (uVar13 <= uVar10 && uVar10 - uVar13 != 0);
  }
  return;
}

Assistant:

void RigidBody::updateAtomVel() {
    Mat3x3d skewMat;

    Vector3d ji = getJ();
    Mat3x3d I   = getI();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = ji[2] / I(2, 2);
    skewMat(0, 2) = -ji[1] / I(1, 1);

    skewMat(1, 0) = -ji[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = ji[0] / I(0, 0);

    skewMat(2, 0) = ji[1] / I(1, 1);
    skewMat(2, 1) = -ji[0] / I(0, 0);
    skewMat(2, 2) = 0;

    Mat3x3d mat    = (getA() * skewMat).transpose();
    Vector3d rbVel = getVel();

    Vector3d velRot;
    for (unsigned int i = 0; i < refCoords_.size(); ++i) {
      atoms_[i]->setVel(rbVel + mat * refCoords_[i]);
    }
  }